

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O0

uint8_t Show_bmp(uint32_t x,uint32_t y,char *path)

{
  FILE *__stream;
  size_t sVar1;
  uint8_t *puStack_70;
  uint32_t ret;
  uint8_t *buf;
  undefined1 auStack_5e [2];
  uint32_t total_length;
  BITMAPINFOHEADER InfoHead;
  BITMAPFILEHEADER FileHead;
  FILE *fp;
  char *path_local;
  uint32_t y_local;
  uint32_t x_local;
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    y_local._3_1_ = 0xff;
  }
  else {
    sVar1 = fread(&InfoHead.ciClrUsed,0xe,1,__stream);
    if ((int)sVar1 == 1) {
      if ((short)InfoHead.ciClrUsed == 0x4d42) {
        printf("\n*****************************************\n");
        printf("BMP_cfSize:%d \n",(ulong)(uint)InfoHead._34_4_);
        printf("BMP_cfoffBits:%d \n",(ulong)FileHead.cfSize);
        sVar1 = fread(auStack_5e,0x28,1,__stream);
        if ((int)sVar1 == 1) {
          printf("BMP_ciSize:%d \n",(ulong)_auStack_5e);
          printf("BMP_ciWidth:%d \n",(ulong)stack0xffffffffffffffa6);
          printf("BMP_ciHeight:%d \n",(ulong)InfoHead.ciSize);
          printf("BMP_ciPlanes:%x \n",(ulong)(ushort)InfoHead.ciWidth);
          printf("BMP_ciBitCount:%x \n",(ulong)InfoHead.ciWidth._2_2_);
          printf("BMP_ciCompress:%x \n",(ulong)InfoHead.ciHeight);
          printf("BMP_ciSizeImage:%x \n",(ulong)(uint)InfoHead._12_4_);
          printf("BMP_ciXPelsPerMeter:%x \n",(ulong)InfoHead.ciCompress);
          printf("BMP_ciYPelsPerMeter:%x \n",(ulong)InfoHead.ciSizeImage);
          printf("BMP_ciClrUsed:%x \n",(ulong)InfoHead.ciXPelsPerMeter);
          printf("BMP_ciClrImportant:%x \n",(ulong)InfoHead.ciYPelsPerMeter);
          printf("*****************************************\n\n");
          buf._4_4_ = InfoHead._34_4_ - FileHead.cfSize;
          bytesPerLine = (stack0xffffffffffffffa6 * InfoHead.ciWidth._2_2_ + 0x1f >> 5) * 4;
          imageSize = bytesPerLine * InfoHead.ciSize;
          skip = 4 - (stack0xffffffffffffffa6 * InfoHead.ciWidth._2_2_ >> 3) & 3;
          printf("total_length:%d,%d\n",(ulong)(uint)InfoHead._12_4_,
                 (ulong)(InfoHead._34_4_ - FileHead.cfSize));
          printf("bytesPerLine = %d\n",(ulong)bytesPerLine);
          printf("imageSize = %d\n",(ulong)imageSize);
          printf("skip = %d\n",(ulong)skip);
          bmp_width = stack0xffffffffffffffa6;
          bmp_height = InfoHead.ciSize;
          bmp_BitCount = InfoHead.ciWidth._2_1_;
          bmp_src_buf = (uint8_t *)calloc(1,(ulong)buf._4_4_);
          if (bmp_src_buf == (uint8_t *)0x0) {
            printf("Load > malloc bmp out of memory!\n");
            y_local._3_1_ = 0xfb;
          }
          else {
            bmp_dst_buf = (uint8_t *)calloc(1,(ulong)buf._4_4_);
            if (bmp_dst_buf == (uint8_t *)0x0) {
              printf("Load > malloc bmp out of memory!\n");
              y_local._3_1_ = 0xfb;
            }
            else {
              fseek(__stream,(ulong)FileHead.cfSize,0);
              puStack_70 = bmp_src_buf;
              do {
                while( true ) {
                  sVar1 = fread(puStack_70,1,(ulong)buf._4_4_,__stream);
                  if ((int)sVar1 != 0) break;
                  usleep(100);
                }
                puStack_70 = puStack_70 + (sVar1 & 0xffffffff);
                buf._4_4_ = buf._4_4_ - (int)sVar1;
              } while (buf._4_4_ != 0);
              if (bmp_BitCount == '\x01') {
                fseek(__stream,0x36,0);
                sVar1 = fread(palette,1,8,__stream);
                if ((int)sVar1 != 8) {
                  printf("Error: fread != 8\n");
                  return 0xfb;
                }
                bmp_dst_buf = (uint8_t *)
                              calloc(1,(ulong)(stack0xffffffffffffffa6 * InfoHead.ciSize));
                if (bmp_dst_buf == (uint8_t *)0x0) {
                  printf("Load > malloc bmp out of memory!\n");
                  return 0xfb;
                }
              }
              else if (bmp_BitCount == '\x04') {
                fseek(__stream,0x36,0);
                sVar1 = fread(palette,1,0x40,__stream);
                if ((int)sVar1 != 0x40) {
                  printf("Error: fread != 64\n");
                  return 0xfb;
                }
                bmp_dst_buf = (uint8_t *)
                              calloc(1,(ulong)(stack0xffffffffffffffa6 * InfoHead.ciSize));
                if (bmp_dst_buf == (uint8_t *)0x0) {
                  printf("Load > malloc bmp out of memory!\n");
                  return 0xfb;
                }
              }
              else if (bmp_BitCount == '\b') {
                fseek(__stream,0x36,0);
                sVar1 = fread(palette,1,0x400,__stream);
                if ((int)sVar1 != 0x400) {
                  printf("Error: fread != 1024\n");
                  return 0xfb;
                }
              }
              Bitmap_format_Matrix(bmp_dst_buf,bmp_src_buf);
              DrawMatrix((uint16_t)x,(uint16_t)y,total_length._2_2_,(uint16_t)InfoHead.ciSize,
                         bmp_dst_buf);
              fclose(__stream);
              y_local._3_1_ = '\0';
            }
          }
        }
        else {
          printf("Read infoheader error!\n");
          fclose(__stream);
          y_local._3_1_ = 0xfc;
        }
      }
      else {
        printf("It\'s not a BMP file\n");
        fclose(__stream);
        y_local._3_1_ = 0xfd;
      }
    }
    else {
      printf("Read header error!\n");
      fclose(__stream);
      y_local._3_1_ = 0xfe;
    }
  }
  return y_local._3_1_;
}

Assistant:

uint8_t Show_bmp(uint32_t x, uint32_t y,char *path)
{
	FILE *fp;//bmp�ļ�ָ��
	BITMAPFILEHEADER FileHead;
	BITMAPINFOHEADER InfoHead;
	uint32_t total_length;
	uint8_t *buf = NULL;
	uint32_t ret = -1;
	 
	fp = fopen(path,"rb");
	if (fp == NULL)
	{
		return(-1);
	}
 
	ret = fread(&FileHead, sizeof(BITMAPFILEHEADER),1, fp);
	if (ret != 1)
	{
		printf("Read header error!\n");
		fclose(fp);
		return(-2);
	}

	//�����Ƿ���bmpͼ��
	if (FileHead.cfType != 0x4D42)//�ļ����ͣ�"BM"(0x4D42)
	{
		printf("It's not a BMP file\n");
		fclose(fp);
		return(-3);
	}
	
	printf("\n*****************************************\n");
	printf("BMP_cfSize:%d \n", FileHead.cfSize);
 	printf("BMP_cfoffBits:%d \n", FileHead.cfoffBits);
	
	ret = fread((char *)&InfoHead, sizeof(BITMAPINFOHEADER),1, fp);
	if (ret != 1)
	{
		printf("Read infoheader error!\n");
		fclose(fp);
		return(-4);
	}
	
	printf("BMP_ciSize:%d \n", InfoHead.ciSize);
 	printf("BMP_ciWidth:%d \n", InfoHead.ciWidth);
	printf("BMP_ciHeight:%d \n", InfoHead.ciHeight);
	printf("BMP_ciPlanes:%x \n", InfoHead.ciPlanes);
	printf("BMP_ciBitCount:%x \n", InfoHead.ciBitCount);
	printf("BMP_ciCompress:%x \n", InfoHead.ciCompress);
	printf("BMP_ciSizeImage:%x \n", InfoHead.ciSizeImage);
	printf("BMP_ciXPelsPerMeter:%x \n", InfoHead.ciXPelsPerMeter);
	printf("BMP_ciYPelsPerMeter:%x \n", InfoHead.ciYPelsPerMeter);
	printf("BMP_ciClrUsed:%x \n", InfoHead.ciClrUsed);
	printf("BMP_ciClrImportant:%x \n", InfoHead.ciClrImportant);
 	printf("*****************************************\n\n");
	
	total_length = FileHead.cfSize-FileHead.cfoffBits;
	bytesPerLine=((InfoHead.ciWidth*InfoHead.ciBitCount+31)>>5)<<2;
	imageSize=bytesPerLine*InfoHead.ciHeight;
	skip=(4-((InfoHead.ciWidth*InfoHead.ciBitCount)>>3))&3;
	
	printf("total_length:%d,%d\n", InfoHead.ciSizeImage,FileHead.cfSize-FileHead.cfoffBits);
	printf("bytesPerLine = %d\n", bytesPerLine);
	printf("imageSize = %d\n", imageSize);
	printf("skip = %d\n", skip);
	
    bmp_width = InfoHead.ciWidth;
    bmp_height = InfoHead.ciHeight;
	bmp_BitCount = InfoHead.ciBitCount;
	
    bmp_src_buf = (uint8_t*)calloc(1,total_length);
    if(bmp_src_buf == NULL){
        printf("Load > malloc bmp out of memory!\n");
        return -5;
    }
	
	bmp_dst_buf = (uint8_t*)calloc(1,total_length);
    if(bmp_dst_buf == NULL){
        printf("Load > malloc bmp out of memory!\n");
        return -5;
    }

	 //��ת��������
    fseek(fp, FileHead.cfoffBits, SEEK_SET);
	
	//ÿ���ֽ���
    buf = bmp_src_buf;
    while ((ret = fread(buf,1,total_length,fp)) >= 0) 
	{
        if (ret == 0) 
		{
            usleep(100);
            continue;
        }
		buf = ((uint8_t*)buf) + ret;
        total_length = total_length - ret;
        if(total_length == 0)
            break;
    }
	
	//��ת�����԰�
	switch(bmp_BitCount)
	{	
		case 1:
			fseek(fp, 54, SEEK_SET);
			ret = fread(palette,1,4*2,fp);
			if (ret != 8) 
			{
				printf("Error: fread != 8\n");
				return -5;
			}
		
			bmp_dst_buf = (uint8_t*)calloc(1,InfoHead.ciWidth * InfoHead.ciHeight);
			if(bmp_dst_buf == NULL)
			{
				printf("Load > malloc bmp out of memory!\n");
				return -5;
			}
		break;
		
		case 4:
			fseek(fp, 54, SEEK_SET);
			ret = fread(palette,1,4*16,fp);
			if (ret != 64) 
			{
				printf("Error: fread != 64\n");
				return -5;
			}
		
			bmp_dst_buf = (uint8_t*)calloc(1,InfoHead.ciWidth * InfoHead.ciHeight);
			if(bmp_dst_buf == NULL)
			{
				printf("Load > malloc bmp out of memory!\n");
				return -5;
			}
		break;
		
		case 8:
			fseek(fp, 54, SEEK_SET);

			ret = fread(palette,1,4*256,fp);

			if (ret != 1024) 
			{
				printf("Error: fread != 1024\n");
				return -5;
			}
		break;
		
		default:
		break;
	}

	Bitmap_format_Matrix(bmp_dst_buf,bmp_src_buf);
	DrawMatrix(x, y,InfoHead.ciWidth, InfoHead.ciHeight, bmp_dst_buf);

	fclose(fp);
	return(0);
}